

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_getshortstr(Table *t,TString *key)

{
  Node *pNVar1;
  long lVar2;
  
  pNVar1 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
  while (((pNVar1->i_key).nk.tt_ != 0x44 || ((TString *)(pNVar1->i_key).nk.value_.gc != key))) {
    lVar2 = (long)(pNVar1->i_key).nk.next;
    pNVar1 = pNVar1 + lVar2;
    if (lVar2 == 0) {
      return &luaO_nilobject_;
    }
  }
  return &pNVar1->i_val;
}

Assistant:

const TValue *luaH_getshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(key->tt == LUA_TSHRSTR);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    const TValue *k = gkey(n);
    if (ttisshrstring(k) && eqshrstr(tsvalue(k), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return luaO_nilobject;  /* not found */
      n += nx;
    }
  }
}